

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O3

void dyn_tbl_update(dyn_tbl_t *dyn_tbl,uchar *key_str,int val)

{
  long *plVar1;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> _Var2;
  int iVar3;
  const_iterator __it;
  uint uVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  _Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true> _Var7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  dyn_tbl_key_t key;
  key_type kStack_38;
  
  kStack_38.key[8] = '\0';
  kStack_38.key[9] = '\0';
  kStack_38.key[10] = '\0';
  kStack_38.key[0xb] = '\0';
  kStack_38.key[0xc] = '\0';
  kStack_38.key[0] = '\0';
  kStack_38.key[1] = '\0';
  kStack_38.key[2] = '\0';
  kStack_38.key[3] = '\0';
  kStack_38.key[4] = '\0';
  kStack_38.key[5] = '\0';
  kStack_38.key[6] = '\0';
  kStack_38.key[7] = '\0';
  memcpy(&kStack_38,key_str,(ulong)(dyn_tbl->lgn >> 3));
  lVar10 = (long)val;
  dyn_tbl->total = dyn_tbl->total + lVar10;
  iVar5 = std::
          _Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)dyn_tbl,&kStack_38);
  if (iVar5.super__Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>._M_cur !=
      (__node_type *)0x0) {
    pmVar6 = std::__detail::
             _Map_base<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)dyn_tbl,&kStack_38);
    *pmVar6 = *pmVar6 + lVar10;
    goto LAB_00103fc8;
  }
  lVar11 = lVar10;
  if ((ulong)dyn_tbl->max_len <= (dyn_tbl->array)._M_h._M_element_count) {
    iVar3 = (int)(dyn_tbl->total / dyn_tbl->T);
    uVar4 = (iVar3 + 2) * (iVar3 + 1) - 1;
    if (dyn_tbl->max_len < uVar4) {
      dyn_tbl->max_len = uVar4;
    }
    else {
      _Var2._M_cur = (__node_type *)(dyn_tbl->array)._M_h._M_before_begin._M_nxt;
      _Var7._M_cur = _Var2._M_cur;
      lVar9 = lVar10;
      if (_Var2._M_cur == (__node_type *)0x0) {
        dyn_tbl->decrement = dyn_tbl->decrement + val;
        goto LAB_00103fc8;
      }
      do {
        lVar11 = *(long *)((long)&((_Var7._M_cur)->
                                  super__Hash_node_value<std::pair<const_dyn_tbl_key_s,_long_long>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_dyn_tbl_key_s,_long_long>_>
                                  ._M_storage._M_storage + 0x10);
        _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt;
        if (lVar11 < lVar9) {
          lVar9 = lVar11;
        }
      } while (_Var7._M_cur != (__node_type *)0x0);
      dyn_tbl->decrement = dyn_tbl->decrement + (int)lVar9;
      while (__it.super__Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>._M_cur
                  = (_Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>)
                    (_Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>)
                    _Var2._M_cur,
            __it.super__Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>._M_cur
            != (__node_type *)0x0) {
        plVar1 = (long *)((long)__it.
                                super__Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>
                                ._M_cur + 0x18);
        lVar11 = *plVar1;
        *plVar1 = *plVar1 - lVar9;
        _Var2._M_cur = *(__node_type **)
                        __it.
                        super__Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>.
                        _M_cur;
        if (*plVar1 == 0 || SBORROW8(lVar11,lVar9) != *plVar1 < 0) {
          std::
          _Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::erase((_Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)dyn_tbl,__it);
        }
      }
      lVar11 = lVar10 - lVar9;
      if (lVar11 == 0 || lVar10 < lVar9) goto LAB_00103fc8;
      if ((ulong)dyn_tbl->max_len <= (dyn_tbl->array)._M_h._M_element_count) {
        dyn_tbl_update();
      }
    }
  }
  pmVar6 = std::__detail::
           _Map_base<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)dyn_tbl,&kStack_38);
  *pmVar6 = lVar11;
LAB_00103fc8:
  iVar5 = std::
          _Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)dyn_tbl,&kStack_38);
  if (iVar5.super__Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>._M_cur ==
      (__node_type *)0x0) {
    uVar8 = (ulong)dyn_tbl->decrement;
  }
  else {
    pmVar6 = std::__detail::
             _Map_base<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)dyn_tbl,&kStack_38);
    uVar8 = (ulong)dyn_tbl->decrement + *pmVar6;
  }
  if (dyn_tbl->max_value < (long)uVar8) {
    dyn_tbl->max_value = uVar8;
  }
  return;
}

Assistant:

void dyn_tbl_update(dyn_tbl_t* dyn_tbl, unsigned char* key_str, int val) {
	dyn_tbl_key_t key;
	memset(key.key, 0, sizeof(key.key));
	memcpy(key.key, key_str, dyn_tbl->lgn / 8);
	dyn_tbl->total += val;

	if (dyn_tbl->array.find(key) != dyn_tbl->array.end()) {
		dyn_tbl->array[key] += val;
	}
	else {
		unsigned int frac = dyn_tbl->total / dyn_tbl->T;
		if (dyn_tbl->array.size() < dyn_tbl->max_len) {
			dyn_tbl->array[key] = val;
		}
		else if (dyn_tbl->max_len < (frac + 1) * (frac + 2) - 1) {
			dyn_tbl->max_len = (frac + 1) * (frac + 2) - 1;
			dyn_tbl->array[key] = val;
		}
		else {
			// std::unordered_map<dyn_tbl_key_t, long long>::iterator it;
			long long min = val;
			for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
				if (it->second < min) {
					min = it->second;
				}
			}
			dyn_tbl->decrement += min;
			for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ) {
				it->second -= min;
				if (it->second <= 0) {
					dyn_tbl->array.erase(it++);
				}
				else {
					it++;
				}
			}
			if (min < val) {
				if (dyn_tbl->array.size() >= dyn_tbl->max_len) {
					fprintf(stderr, "Warning: maj tbl update error\n");
				}
				dyn_tbl->array[key] = val - min;
			}
		}
	}
	long long value = 0;
	if (dyn_tbl->array.find(key) != dyn_tbl->array.end()) {
		value = dyn_tbl->array[key] + dyn_tbl->decrement;
	}
	else {
		value = dyn_tbl->decrement;
	}
	if (value > dyn_tbl->max_value)
		dyn_tbl->max_value = value;
}